

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputLZWDecodeStream.cpp
# Opt level: O0

int __thiscall InputLZWDecodeStream::GetCode(InputLZWDecodeStream *this)

{
  int iVar1;
  int iVar2;
  byte local_21 [5];
  uint uStack_1c;
  Byte buffer;
  int code;
  int c;
  InputLZWDecodeStream *this_local;
  
  _code = this;
  while( true ) {
    if (this->nextBits <= this->inputBits) {
      iVar1 = this->inputBuf;
      iVar2 = this->inputBits;
      this->inputBits = this->inputBits - this->nextBits;
      this->inputBuf = this->inputBuf & (1 << ((byte)this->inputBits & 0x1f)) - 1U;
      return iVar1 >> ((char)iVar2 - (char)this->nextBits & 0x1fU) &
             (1 << ((byte)this->nextBits & 0x1f)) - 1U;
    }
    (*this->mSourceStream->_vptr_IByteReader[2])(this->mSourceStream,local_21,1);
    uStack_1c = (uint)local_21[0];
    if (uStack_1c == 0xffffffff) break;
    this->inputBuf = this->inputBuf << 8 | uStack_1c;
    this->inputBits = this->inputBits + 8;
  }
  return -1;
}

Assistant:

int InputLZWDecodeStream::GetCode() {
	int c;
	int code;

	IOBasicTypes::Byte buffer;
	while (inputBits < nextBits) 
	{
		mSourceStream->Read(&buffer, 1);
		c = buffer;

		if (c == -1) return -1;
		inputBuf = (inputBuf << 8) | (c & 0xff);
		inputBits += 8;
	}
	code = (inputBuf >> (inputBits - nextBits)) & ((1 << nextBits) - 1);
	inputBits -= nextBits;
	inputBuf = inputBuf & ((1 << inputBits) - 1); // avoid overflow by limiting to the bits its supposed to use 
	return code;
}